

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_264_12_f950f0f9_for_proto *pp;
  uint *puVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode CVar10;
  int iVar11;
  uint uVar12;
  CURLofft CVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  curl_off_t size_00;
  Curl_easy *pCVar18;
  char *pcVar19;
  byte *ptr;
  ulong uStack_70;
  curl_off_t size;
  int imapcode;
  ulong local_50;
  SASL *local_48;
  size_t nread;
  char *local_38;
  
  sockfd = conn->sock[0];
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar9 = imap_perform_upgrade_tls(conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
    return CVar9;
  }
  local_48 = &(conn->proto).imapc.sasl;
  do {
    CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&imapcode,&nread);
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (imapcode == -1) {
      return CURLE_WEIRD_SERVER_REPLY;
    }
    if (imapcode == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      if (imapcode != 1) {
        pCVar18 = conn->data;
        if (imapcode != 3) {
          Curl_failf(pCVar18,"Got unexpected imap-server response");
          return CURLE_WEIRD_SERVER_REPLY;
        }
        (conn->proto).imapc.preauth = true;
        Curl_infof(pCVar18,"PREAUTH connection, already authenticated!\n");
      }
      CVar10 = imap_perform_capability(conn);
      break;
    case IMAP_CAPABILITY:
      pCVar18 = conn->data;
      if (imapcode != 1) {
        if (imapcode == 0x2a) {
          ptr = (byte *)((pCVar18->state).buffer + 2);
LAB_001288da:
          do {
            uVar15 = (ulong)*ptr;
            if (uVar15 < 0x21) {
              if ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0) {
                ptr = ptr + 1;
                goto LAB_001288da;
              }
              if (uVar15 == 0) goto LAB_00128b87;
            }
            sVar16 = 0xfffffffffffffffb;
            while ((0x20 < (byte)uVar15 || ((0x100002601U >> (uVar15 & 0x3f) & 1) == 0))) {
              lVar6 = sVar16 + 6;
              sVar16 = sVar16 + 1;
              uVar15 = (ulong)ptr[lVar6];
            }
            uStack_70 = sVar16 + 5;
            if (uStack_70 == 7) {
              iVar11 = bcmp(ptr,"SASL-IR",7);
              if (iVar11 != 0) goto LAB_0012898e;
              (conn->proto).imapc.ir_supported = true;
              uStack_70 = 7;
            }
            else if (uStack_70 == 0xd) {
              iVar11 = bcmp(ptr,"LOGINDISABLED",0xd);
              if (iVar11 != 0) goto LAB_0012898e;
              (conn->proto).imapc.login_disabled = true;
              uStack_70 = 0xd;
            }
            else if (uStack_70 == 8) {
              if (*(long *)ptr != 0x534c545452415453) goto LAB_0012898e;
              (conn->proto).imapc.tls_supported = true;
              uStack_70 = 8;
            }
            else if (5 < uStack_70) {
LAB_0012898e:
              iVar11 = bcmp(ptr,"AUTH=",5);
              if (iVar11 == 0) {
                ptr = ptr + 5;
                uVar12 = Curl_sasl_decode_mech((char *)ptr,sVar16,(size_t *)&size);
                uStack_70 = sVar16;
                if ((uVar12 != 0) && (size == sVar16)) {
                  puVar1 = (uint *)((long)&conn->proto + 0xa4);
                  *puVar1 = *puVar1 | uVar12;
                }
              }
            }
            ptr = ptr + uStack_70;
          } while( true );
        }
LAB_00128b73:
        CVar10 = imap_perform_authentication(conn);
        break;
      }
      cVar3 = (pCVar18->set).use_ssl;
      if ((cVar3 == CURLUSESSL_NONE) || ((conn->ssl[0].field_0x10 & 1) != 0)) goto LAB_00128b73;
      if ((conn->proto).imapc.tls_supported != true) {
        if (cVar3 != CURLUSESSL_TRY) {
          pcVar19 = "STARTTLS not supported.";
          goto LAB_00128dbd;
        }
        goto LAB_00128b73;
      }
      CVar9 = imap_sendf(conn,"STARTTLS");
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      (conn->proto).imapc.state = IMAP_STARTTLS;
      goto LAB_00128b94;
    case IMAP_STARTTLS:
      if (imapcode != 1) {
        pCVar18 = conn->data;
        if ((pCVar18->set).use_ssl != CURLUSESSL_TRY) {
          pcVar19 = "STARTTLS denied";
LAB_00128dbd:
          Curl_failf(pCVar18,pcVar19);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_00128b73;
      }
      CVar10 = imap_perform_upgrade_tls(conn);
      break;
    default:
      goto switchD_0012872a_caseD_4;
    case IMAP_AUTHENTICATE:
      pCVar18 = conn->data;
      CVar10 = Curl_sasl_continue(local_48,conn,imapcode,(saslprogress *)&size);
      if (CVar10 == CURLE_OK) {
        if ((int)size == 0) {
          if (((conn->proto).imapc.login_disabled == false) &&
             (((conn->proto).ftpc.cwdfail & 1U) != 0)) {
            CVar10 = imap_perform_login(conn);
          }
          else {
            Curl_failf(pCVar18,"Authentication cancelled");
            CVar10 = CURLE_LOGIN_DENIED;
          }
        }
        else {
          CVar10 = CURLE_OK;
          CVar9 = CURLE_OK;
          if ((int)size == 2) goto LAB_00128b13;
        }
      }
      break;
    case IMAP_LOGIN:
      if (imapcode != 1) {
        Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)imapcode);
        return CURLE_LOGIN_DENIED;
      }
      goto switchD_0012872a_caseD_4;
    case IMAP_LIST:
    case IMAP_SEARCH:
      if (imapcode != 0x2a) {
        if (imapcode != 1) {
          return CURLE_QUOTE_ERROR;
        }
        goto switchD_0012872a_caseD_4;
      }
      pcVar19 = (conn->data->state).buffer;
      sVar14 = strlen(pcVar19);
      pcVar19[sVar14] = '\n';
      CVar10 = Curl_client_write(conn,1,pcVar19,sVar14 + 1);
      pcVar19[sVar14] = '\0';
      break;
    case IMAP_SELECT:
      pCVar18 = conn->data;
      if (imapcode == 1) {
        pvVar4 = (pCVar18->req).protop;
        if (((*(char **)((long)pvVar4 + 0x10) != (char *)0x0) &&
            (pcVar19 = (conn->proto).imapc.mailbox_uidvalidity, pcVar19 != (char *)0x0)) &&
           (iVar11 = Curl_strcasecompare(*(char **)((long)pvVar4 + 0x10),pcVar19), iVar11 == 0)) {
          Curl_failf(conn->data,"Mailbox UIDVALIDITY has changed");
          return CURLE_REMOTE_FILE_NOT_FOUND;
        }
        pcVar19 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
        (conn->proto).imapc.mailbox = pcVar19;
        if (*(long *)((long)pvVar4 + 0x40) == 0) {
          if (*(long *)((long)pvVar4 + 0x38) == 0) {
            CVar10 = imap_perform_fetch(conn);
          }
          else {
            CVar10 = imap_perform_search(conn);
          }
        }
        else {
          CVar10 = imap_perform_list(conn);
        }
        break;
      }
      if (imapcode != 0x2a) {
        Curl_failf(pCVar18,"Select failed");
        return CURLE_LOGIN_DENIED;
      }
      iVar11 = __isoc99_sscanf((pCVar18->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",&size)
      ;
      if (iVar11 == 1) {
        (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
        (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
        pcVar19 = (*Curl_cstrdup)((char *)&size);
        (conn->proto).imapc.mailbox_uidvalidity = pcVar19;
      }
      goto LAB_00128b87;
    case IMAP_FETCH:
      pCVar18 = conn->data;
      pcVar19 = (pCVar18->state).buffer;
      size = 0;
      pcVar5 = pcVar19;
      if (imapcode == 0x2a) {
        while( true ) {
          if (*pcVar5 == '\0') break;
          if (*pcVar5 == '{') {
            CVar13 = curlx_strtoofft(pcVar5 + 1,&local_38,10,&size);
            if ((((CVar13 == CURL_OFFT_OK) && (1 < (long)local_38 - (long)pcVar19)) &&
                (*local_38 == '}')) && ((local_38[1] == '\r' && (local_38[2] == '\0')))) {
              Curl_infof(pCVar18,"Found %ld bytes to download\n",size);
              Curl_pgrsSetDownloadSize(pCVar18,size);
              pcVar19 = (pp->ftpc).pp.cache;
              if (pcVar19 != (char *)0x0) {
                uVar15 = (conn->proto).ftpc.pp.cache_size;
                uVar17 = size;
                if (uVar15 < (ulong)size) {
                  uVar17 = uVar15;
                }
                if (uVar17 == 0) {
                  CVar9 = CURLE_OK;
                  goto LAB_00128b13;
                }
                local_50 = uVar17;
                CVar10 = Curl_client_write(conn,1,pcVar19,uVar17);
                uVar15 = local_50;
                if (CVar10 != CURLE_OK) goto LAB_00128b7e;
                pcVar2 = &(pCVar18->req).bytecount;
                *pcVar2 = *pcVar2 + local_50;
                Curl_infof(pCVar18,"Written %zu bytes, %lu bytes are left for transfer\n",local_50);
                uVar7 = local_50;
                uVar17 = (conn->proto).ftpc.pp.cache_size;
                sVar14 = uVar17 - uVar15;
                if (uVar17 < uVar15 || sVar14 == 0) {
                  (*Curl_cfree)((pp->ftpc).pp.cache);
                  (pp->ftpc).pp.cache = (char *)0x0;
                  sVar16 = 0;
                }
                else {
                  memmove((conn->proto).rtmp,(void *)((long)(conn->proto).rtmp + local_50),sVar14);
                  sVar16 = (conn->proto).ftpc.pp.cache_size - uVar7;
                }
                (conn->proto).ftpc.pp.cache_size = sVar16;
              }
              if ((pCVar18->req).bytecount == size) {
                iVar11 = -1;
                size_00 = -1;
              }
              else {
                (pCVar18->req).maxdownload = size;
                pCVar18->conn->cselect_bits = 1;
                iVar11 = 0;
                size_00 = size;
              }
              Curl_setup_transfer(pCVar18,iVar11,size_00,false,-1);
              CVar9 = CURLE_OK;
              goto LAB_00128b13;
            }
            break;
          }
          pcVar19 = pcVar19 + 1;
          pcVar5 = pcVar5 + 1;
        }
        Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
        CVar9 = CURLE_WEIRD_SERVER_REPLY;
      }
      else {
        Curl_pgrsSetDownloadSize(pCVar18,-1);
        CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
      }
LAB_00128b13:
      CVar10 = CVar9;
      (conn->proto).imapc.state = IMAP_STOP;
      break;
    case IMAP_FETCH_FINAL:
      if (imapcode != 1) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      goto switchD_0012872a_caseD_4;
    case IMAP_APPEND:
      if (imapcode != 0x2b) {
        return CURLE_UPLOAD_FAILED;
      }
      pCVar18 = conn->data;
      Curl_pgrsSetUploadSize(pCVar18,(pCVar18->state).infilesize);
      Curl_setup_transfer(pCVar18,-1,-1,false,0);
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_APPEND_FINAL:
      if (imapcode != 1) {
        return CURLE_UPLOAD_FAILED;
      }
switchD_0012872a_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    }
LAB_00128b7e:
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
LAB_00128b87:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_00128b94:
    _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var8) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
    case IMAP_SEARCH:
      result = imap_state_listsearch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}